

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spvc_reflected_builtin_resource,_8UL>::reserve
          (SmallVector<spvc_reflected_builtin_resource,_8UL> *this,size_t count)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  spvc_reflected_builtin_resource *psVar8;
  long lVar9;
  size_t i;
  ulong uVar10;
  spvc_reflected_builtin_resource *psVar11;
  
  if (count >> 0x3b == 0) {
    uVar7 = this->buffer_capacity;
    if (uVar7 < count) {
      uVar10 = 8;
      if (8 < uVar7) {
        uVar10 = uVar7;
      }
      do {
        uVar7 = uVar10;
        uVar10 = uVar7 * 2;
      } while (uVar7 < count);
      if (uVar7 < 9) {
        psVar8 = (spvc_reflected_builtin_resource *)&this->stack_storage;
      }
      else {
        psVar8 = (spvc_reflected_builtin_resource *)malloc(uVar7 << 5);
        if (psVar8 == (spvc_reflected_builtin_resource *)0x0) goto LAB_001ab45c;
      }
      psVar11 = (this->super_VectorView<spvc_reflected_builtin_resource>).ptr;
      if (psVar8 != psVar11) {
        lVar9 = 0;
        for (uVar10 = 0;
            uVar10 < (this->super_VectorView<spvc_reflected_builtin_resource>).buffer_size;
            uVar10 = uVar10 + 1) {
          psVar11 = (this->super_VectorView<spvc_reflected_builtin_resource>).ptr;
          puVar1 = (undefined8 *)((long)&psVar11->builtin + lVar9);
          uVar4 = *puVar1;
          uVar5 = puVar1[1];
          puVar1 = (undefined8 *)((long)&(psVar11->resource).type_id + lVar9);
          uVar6 = puVar1[1];
          puVar3 = (undefined8 *)((long)&(psVar8->resource).type_id + lVar9);
          *puVar3 = *puVar1;
          puVar3[1] = uVar6;
          pcVar2 = (char *)((long)&psVar8->builtin + lVar9);
          *(undefined8 *)pcVar2 = uVar4;
          *(undefined8 *)(pcVar2 + 8) = uVar5;
          lVar9 = lVar9 + 0x20;
        }
        psVar11 = (this->super_VectorView<spvc_reflected_builtin_resource>).ptr;
      }
      if (psVar11 != (spvc_reflected_builtin_resource *)&this->stack_storage) {
        free(psVar11);
      }
      (this->super_VectorView<spvc_reflected_builtin_resource>).ptr = psVar8;
      this->buffer_capacity = uVar7;
    }
    return;
  }
LAB_001ab45c:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}